

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

bool dg::vr::RelationsAnalyzer::isDangerous(I inst)

{
  bool bVar1;
  ret_type pSVar2;
  StoreInst *store;
  Instruction *in_stack_ffffffffffffffe0;
  undefined1 local_1;
  
  pSVar2 = llvm::dyn_cast<llvm::StoreInst,llvm::Instruction_const>(in_stack_ffffffffffffffe0);
  if (pSVar2 == (ret_type)0x0) {
    local_1 = true;
  }
  else {
    llvm::StoreInst::getPointerOperand((StoreInst *)0x1cd061);
    bVar1 = llvm::isa<llvm::Constant,llvm::Value_const*>((Value **)0x1cd070);
    if (bVar1) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool RelationsAnalyzer::isDangerous(I inst) {
    const auto *store = llvm::dyn_cast<llvm::StoreInst>(inst);
    if (!store) // most probably CallInst
        // unable to presume anything about such instruction
        return true;

    // if store writes to a fix location, it cannot be easily said which
    // values it affects
    if (llvm::isa<llvm::Constant>(store->getPointerOperand()))
        return true;

    return false;
}